

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::predefine(Preprocessor *this,string *definition,string_view name)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  int iVar6;
  ushort uVar7;
  Token TVar8;
  bool bVar9;
  uint uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  flat_hash_map<std::string_view,_MacroDef> *arrays_;
  char_pointer puVar12;
  uint64_t hash;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char_pointer puVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong pos0;
  TokenKind TVar20;
  char_pointer puVar21;
  raw_key_type *k;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
  *args;
  table_element_pointer ppVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  byte bVar41;
  string_view source;
  iterator iVar42;
  locator res;
  Preprocessor pp;
  undefined1 local_450 [16];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
  *local_440;
  undefined8 uStack_438;
  ulong local_430;
  uint64_t local_428;
  ulong local_420;
  ulong local_418;
  ulong local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  uchar local_3e8;
  uchar uStack_3e7;
  uchar uStack_3e6;
  byte bStack_3e5;
  uchar uStack_3e4;
  uchar uStack_3e3;
  uchar uStack_3e2;
  byte bStack_3e1;
  uchar uStack_3e0;
  uchar uStack_3df;
  uchar uStack_3de;
  byte bStack_3dd;
  uchar uStack_3dc;
  uchar uStack_3db;
  uchar uStack_3da;
  byte bStack_3d9;
  uchar local_3d8;
  uchar uStack_3d7;
  uchar uStack_3d6;
  byte bStack_3d5;
  uchar uStack_3d4;
  uchar uStack_3d3;
  uchar uStack_3d2;
  byte bStack_3d1;
  uchar uStack_3d0;
  uchar uStack_3cf;
  uchar uStack_3ce;
  byte bStack_3cd;
  uchar uStack_3cc;
  uchar uStack_3cb;
  uchar uStack_3ca;
  byte bStack_3c9;
  undefined1 local_3c8 [472];
  Token local_1f0;
  Token local_1e0 [27];
  
  Preprocessor((Preprocessor *)local_3c8,this);
  std::operator+(&local_408,"`define ",definition);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_408,"\n");
  local_450._0_8_ = (pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._0_8_ == paVar13) {
    local_440 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                 *)paVar13->_M_allocated_capacity;
    uStack_438 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
    local_450._0_8_ = (group15<boost::unordered::detail::foa::plain_integral> *)&local_440;
  }
  else {
    local_440 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                 *)paVar13->_M_allocated_capacity;
  }
  local_450._8_8_ = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  source._M_str = (char *)local_450._0_8_;
  source._M_len = local_450._8_8_;
  pushSource((Preprocessor *)local_3c8,source,name);
  if ((group15<boost::unordered::detail::foa::plain_integral> *)local_450._0_8_ !=
      (group15<boost::unordered::detail::foa::plain_integral> *)&local_440) {
    operator_delete((void *)local_450._0_8_,(size_t)((long)&(local_440->first)._M_len + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  do {
    if (local_1f0.info == (Info *)0x0) {
      local_1f0 = nextProcessed((Preprocessor *)local_3c8);
      TVar20 = local_1f0.kind;
    }
    else {
      TVar20 = local_1f0.kind;
    }
    TVar8 = local_1f0;
    local_1e0[0].kind = local_1f0.kind;
    local_1e0[0]._2_1_ = local_1f0._2_1_;
    local_1e0[0].numFlags.raw = local_1f0.numFlags.raw;
    local_1e0[0].rawLen = local_1f0.rawLen;
    local_1e0[0].info = local_1f0.info;
    local_1f0 = TVar8;
    Token::Token((Token *)local_450);
    local_1f0.info = (Info *)local_450._8_8_;
    local_1f0.kind = local_450._0_2_;
    local_1f0._2_1_ = local_450[2];
    local_1f0.numFlags.raw = local_450[3];
    local_1f0.rawLen = local_450._4_4_;
  } while (TVar20 != EndOfFile);
  iVar42 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                    *)(local_3c8 + 0x168));
  if (iVar42.p_ != (table_element_pointer)0x0) {
    arrays_ = &this->macros;
LAB_002f6ebe:
    do {
      args = iVar42.p_;
      if ((args->second).intrinsic == None) {
        (args->second).commandLine = true;
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          arrays_,&args->first);
        uVar19 = hash >> ((byte)(arrays_->table_).
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                                .arrays.groups_size_index & 0x3f);
        lVar17 = (hash & 0xff) * 4;
        uVar26 = (&UNK_0051239c)[lVar17];
        uVar27 = (&UNK_0051239d)[lVar17];
        uVar28 = (&UNK_0051239e)[lVar17];
        bVar29 = (&UNK_0051239f)[lVar17];
        uVar16 = (ulong)((uint)hash & 7);
        uVar18 = 0;
        pos0 = uVar19;
        uVar30 = uVar26;
        uVar31 = uVar27;
        uVar32 = uVar28;
        bVar33 = bVar29;
        uVar34 = uVar26;
        uVar35 = uVar27;
        uVar36 = uVar28;
        bVar37 = bVar29;
        uVar38 = uVar26;
        uVar39 = uVar27;
        uVar40 = uVar28;
        bVar41 = bVar29;
        do {
          pgVar3 = (this->macros).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                   .arrays.groups_;
          pgVar2 = pgVar3 + uVar19;
          local_3d8 = pgVar2->m[0].n;
          uStack_3d7 = pgVar2->m[1].n;
          uStack_3d6 = pgVar2->m[2].n;
          bStack_3d5 = pgVar2->m[3].n;
          uStack_3d4 = pgVar2->m[4].n;
          uStack_3d3 = pgVar2->m[5].n;
          uStack_3d2 = pgVar2->m[6].n;
          bStack_3d1 = pgVar2->m[7].n;
          uStack_3d0 = pgVar2->m[8].n;
          uStack_3cf = pgVar2->m[9].n;
          uStack_3ce = pgVar2->m[10].n;
          bStack_3cd = pgVar2->m[0xb].n;
          uStack_3cc = pgVar2->m[0xc].n;
          uStack_3cb = pgVar2->m[0xd].n;
          uStack_3ca = pgVar2->m[0xe].n;
          bVar15 = pgVar2->m[0xf].n;
          auVar25[0] = -(local_3d8 == uVar26);
          auVar25[1] = -(uStack_3d7 == uVar27);
          auVar25[2] = -(uStack_3d6 == uVar28);
          auVar25[3] = -(bStack_3d5 == bVar29);
          auVar25[4] = -(uStack_3d4 == uVar30);
          auVar25[5] = -(uStack_3d3 == uVar31);
          auVar25[6] = -(uStack_3d2 == uVar32);
          auVar25[7] = -(bStack_3d1 == bVar33);
          auVar25[8] = -(uStack_3d0 == uVar34);
          auVar25[9] = -(uStack_3cf == uVar35);
          auVar25[10] = -(uStack_3ce == uVar36);
          auVar25[0xb] = -(bStack_3cd == bVar37);
          auVar25[0xc] = -(uStack_3cc == uVar38);
          auVar25[0xd] = -(uStack_3cb == uVar39);
          auVar25[0xe] = -(uStack_3ca == uVar40);
          auVar25[0xf] = -(bVar15 == bVar41);
          uVar10 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
          bStack_3c9 = bVar15;
          if (uVar10 != 0) {
            ppVar4 = (this->macros).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                     .arrays.elements_;
            local_430 = pos0;
            local_428 = hash;
            local_420 = uVar18;
            local_418 = uVar19;
            local_410 = uVar16;
            local_3e8 = uVar26;
            uStack_3e7 = uVar27;
            uStack_3e6 = uVar28;
            bStack_3e5 = bVar29;
            uStack_3e4 = uVar30;
            uStack_3e3 = uVar31;
            uStack_3e2 = uVar32;
            bStack_3e1 = bVar33;
            uStack_3e0 = uVar34;
            uStack_3df = uVar35;
            uStack_3de = uVar36;
            bStack_3dd = bVar37;
            uStack_3dc = uVar38;
            uStack_3db = uVar39;
            uStack_3da = uVar40;
            bStack_3d9 = bVar41;
            do {
              iVar6 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                }
              }
              bVar9 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )arrays_,&args->first,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 ((long)&ppVar4[uVar19 * 0xf].first._M_len +
                                 (ulong)(uint)(iVar6 << 5)));
              if (bVar9) goto LAB_002f6ec9;
              uVar10 = uVar10 - 1 & uVar10;
            } while (uVar10 != 0);
            bVar15 = pgVar3[uVar19].m[0xf].n;
            hash = local_428;
            uVar16 = local_410;
            uVar19 = local_418;
            uVar18 = local_420;
            pos0 = local_430;
            uVar26 = local_3e8;
            uVar27 = uStack_3e7;
            uVar28 = uStack_3e6;
            bVar29 = bStack_3e5;
            uVar30 = uStack_3e4;
            uVar31 = uStack_3e3;
            uVar32 = uStack_3e2;
            bVar33 = bStack_3e1;
            uVar34 = uStack_3e0;
            uVar35 = uStack_3df;
            uVar36 = uStack_3de;
            bVar37 = bStack_3dd;
            uVar38 = uStack_3dc;
            uVar39 = uStack_3db;
            uVar40 = uStack_3da;
            bVar41 = bStack_3d9;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[uVar16] & bVar15) == 0) break;
          uVar5 = (this->macros).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                  .arrays.groups_size_mask;
          lVar17 = uVar19 + uVar18;
          uVar18 = uVar18 + 1;
          uVar19 = lVar17 + 1U & uVar5;
        } while (uVar18 <= uVar5);
        if ((this->macros).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
            .size_ctrl.size <
            (this->macros).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
          ::
          nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>const&>
                    ((locator *)local_450,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                      *)arrays_,(arrays_type *)arrays_,pos0,hash,args);
          psVar1 = &(this->macros).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
          ::
          unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>const&>
                    ((locator *)local_450,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                      *)arrays_,hash,args);
        }
      }
LAB_002f6ec9:
      puVar14 = iVar42.pc_ + 0x12;
      puVar21 = iVar42.pc_ + 2;
      while( true ) {
        puVar12 = puVar21;
        puVar21 = iVar42.pc_;
        ppVar22 = iVar42.p_ + 1;
        if (((uint)iVar42.pc_ & 0xf) == 0xe) break;
        iVar42.p_ = ppVar22;
        iVar42.pc_ = puVar21 + 1;
        puVar14 = puVar14 + 1;
        puVar21 = puVar12 + 1;
        if (puVar12[-1] != '\0') goto code_r0x002f6ef4;
      }
      auVar23[0] = -(*puVar12 == '\0');
      auVar23[1] = -(puVar12[1] == '\0');
      auVar23[2] = -(puVar12[2] == '\0');
      auVar23[3] = -(puVar12[3] == '\0');
      auVar23[4] = -(puVar12[4] == '\0');
      auVar23[5] = -(puVar12[5] == '\0');
      auVar23[6] = -(puVar12[6] == '\0');
      auVar23[7] = -(puVar12[7] == '\0');
      auVar23[8] = -(puVar12[8] == '\0');
      auVar23[9] = -(puVar12[9] == '\0');
      auVar23[10] = -(puVar12[10] == '\0');
      auVar23[0xb] = -(puVar12[0xb] == '\0');
      auVar23[0xc] = -(puVar12[0xc] == '\0');
      auVar23[0xd] = -(puVar12[0xd] == '\0');
      auVar23[0xe] = -(puVar12[0xe] == '\0');
      auVar23[0xf] = -(puVar12[0xf] == '\0');
      uVar7 = (ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe;
      while (uVar7 == 0x7fff) {
        ppVar22 = ppVar22 + 0xf;
        auVar24[0] = -(*puVar14 == '\0');
        auVar24[1] = -(puVar14[1] == '\0');
        auVar24[2] = -(puVar14[2] == '\0');
        auVar24[3] = -(puVar14[3] == '\0');
        auVar24[4] = -(puVar14[4] == '\0');
        auVar24[5] = -(puVar14[5] == '\0');
        auVar24[6] = -(puVar14[6] == '\0');
        auVar24[7] = -(puVar14[7] == '\0');
        auVar24[8] = -(puVar14[8] == '\0');
        auVar24[9] = -(puVar14[9] == '\0');
        auVar24[10] = -(puVar14[10] == '\0');
        auVar24[0xb] = -(puVar14[0xb] == '\0');
        auVar24[0xc] = -(puVar14[0xc] == '\0');
        auVar24[0xd] = -(puVar14[0xd] == '\0');
        auVar24[0xe] = -(puVar14[0xe] == '\0');
        auVar24[0xf] = -(puVar14[0xf] == '\0');
        puVar12 = puVar14;
        puVar14 = puVar14 + 0x10;
        uVar7 = (ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe;
      }
      uVar10 = 0;
      if ((uVar7 ^ 0x7fff) != 0) {
        for (; ((uVar7 ^ 0x7fff) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if (puVar12[uVar10] == '\x01') break;
      iVar42.p_ = (table_element_pointer)((long)&(ppVar22->first)._M_len + (ulong)(uVar10 << 5));
      iVar42.pc_ = puVar12 + uVar10;
    } while( true );
  }
LAB_002f70f5:
  ~Preprocessor((Preprocessor *)local_3c8);
  return;
code_r0x002f6ef4:
  if (puVar12[-1] != '\x01') {
    iVar42.pc_ = puVar12 + -1;
    goto LAB_002f6ebe;
  }
  goto LAB_002f70f5;
}

Assistant:

void Preprocessor::predefine(const std::string& definition, std::string_view name) {
    Preprocessor pp(*this);
    pp.pushSource("`define " + definition + "\n", name);

    // Consume all of the definition text.
    while (pp.next().kind != TokenKind::EndOfFile) {
        // Nothing to do but keep going.
    }

    // Look for the macro in the temporary preprocessor's macro map.
    // Any macros found that are not the built-in intrinsic macros should
    // be copied over to our own map.
    for (auto& pair : pp.macros) {
        if (!pair.second.isIntrinsic()) {
            pair.second.commandLine = true;
            macros.insert(pair);
        }
    }
}